

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::ConsoleReporter::sectionEnded(ConsoleReporter *this,SectionStats *_sectionStats)

{
  TablePrinter *this_00;
  pointer pSVar1;
  pointer pcVar2;
  undefined8 uVar3;
  bool bVar4;
  ostream *poVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char *pcVar7;
  bool bVar8;
  char local_51;
  undefined1 local_50 [12];
  uint uStack_44;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  double local_30;
  
  this_00 = (this->m_tablePrinter).m_ptr;
  if (this_00 == (TablePrinter *)0x0) {
    pcVar7 = 
    "T *Catch::Detail::unique_ptr<Catch::TablePrinter>::operator->() [T = Catch::TablePrinter]";
LAB_001606d0:
    __assert_fail("m_ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                  ,0x385,pcVar7);
  }
  pcVar7 = (char *)_sectionStats;
  TablePrinter::close(this_00,(int)_sectionStats);
  if (_sectionStats->missingAssertions == true) {
    lazyPrint(this);
    local_50._0_8_ = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar7 = 
      "T *Catch::Detail::unique_ptr<Catch::ColourImpl>::operator->() [T = Catch::ColourImpl]";
      goto LAB_001606d0;
    }
    local_50._8_4_ = BrightRed;
    uStack_44 = uStack_44 & 0xffffff00;
    ColourImpl::ColourGuard::engageImpl
              ((ColourGuard *)local_50,
               (this->super_StreamingReporterBase).super_ReporterBase.m_stream);
    uVar3 = local_50._0_8_;
    bVar4 = uStack_44._0_1_;
    bVar8 = (ulong)(((long)(this->super_StreamingReporterBase).m_sectionStack.
                           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->super_StreamingReporterBase).m_sectionStack.
                           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) <
            2;
    pcVar7 = "\nNo assertions in test case";
    if (!bVar8) {
      pcVar7 = "\nNo assertions in section";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,pcVar7,
               (ulong)bVar8 * 2 + 0x19);
    poVar5 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," \'",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(_sectionStats->sectionInfo).name._M_dataplus._M_p,
                        (_sectionStats->sectionInfo).name._M_string_length);
    pcVar7 = "\'\n\n";
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n\n",3);
    std::ostream::flush();
    if (bVar4 != false) {
      pcVar7 = (char *)0x0;
      (**(code **)(*(size_type *)uVar3 + 0x10))(uVar3);
    }
  }
  local_30 = _sectionStats->durationInSeconds;
  bVar4 = shouldShowDuration((this->super_StreamingReporterBase).super_ReporterBase.
                             super_IEventListener.m_config,local_30);
  if (bVar4) {
    poVar5 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    getFormattedDuration_abi_cxx11_((string *)local_50,(Catch *)pcVar7,local_30);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)local_50._0_8_,CONCAT44(uStack_44,local_50._8_4_));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," s: ",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(_sectionStats->sectionInfo).name._M_dataplus._M_p,
                        (_sectionStats->sectionInfo).name._M_string_length);
    local_51 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_51,1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._0_8_ != &local_40) {
      operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
    }
  }
  if (this->m_headerPrinted == true) {
    this->m_headerPrinted = false;
  }
  pSVar1 = (this->super_StreamingReporterBase).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->super_StreamingReporterBase).m_sectionStack.
  super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = pSVar1 + -1;
  pcVar2 = pSVar1[-1].name._M_dataplus._M_p;
  paVar6 = &pSVar1[-1].name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar6) {
    operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ConsoleReporter::sectionEnded(SectionStats const& _sectionStats) {
    m_tablePrinter->close();
    if (_sectionStats.missingAssertions) {
        lazyPrint();
        auto guard =
            m_colour->guardColour( Colour::ResultError ).engage( m_stream );
        if (m_sectionStack.size() > 1)
            m_stream << "\nNo assertions in section";
        else
            m_stream << "\nNo assertions in test case";
        m_stream << " '" << _sectionStats.sectionInfo.name << "'\n\n" << std::flush;
    }
    double dur = _sectionStats.durationInSeconds;
    if (shouldShowDuration(*m_config, dur)) {
        m_stream << getFormattedDuration(dur) << " s: " << _sectionStats.sectionInfo.name << '\n' << std::flush;
    }
    if (m_headerPrinted) {
        m_headerPrinted = false;
    }
    StreamingReporterBase::sectionEnded(_sectionStats);
}